

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseCustomSectionAnnotation(WastParser *this,Module *module)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  TokenType TVar2;
  string_view __x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3f0;
  string_view local_3d8;
  undefined1 local_3c8 [8];
  Custom custom;
  undefined1 local_368 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  allocator<char> local_348;
  allocator<char> local_347;
  allocator<char> local_346;
  allocator<char> local_345;
  allocator<char> local_344;
  allocator<char> local_343;
  allocator<char> local_342;
  allocator<char> local_341;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string asStack_320 [32];
  string asStack_300 [32];
  string asStack_2e0 [32];
  string asStack_2c0 [32];
  string asStack_2a0 [32];
  string asStack_280 [32];
  string asStack_260 [32];
  string asStack_240 [32];
  string asStack_220 [32];
  string asStack_200 [32];
  iterator local_1e0;
  size_type local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  Token local_1b8;
  Token local_178;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_133;
  allocator<char> local_132;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string asStack_110 [32];
  iterator local_f0;
  size_type local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  undefined4 local_c8;
  Enum local_c4;
  undefined1 local_c0 [8];
  string section_name;
  undefined1 local_80 [8];
  Token token;
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  GetLocation((Location *)&token.field_2.literal_.text._M_str,this);
  Consume((Token *)local_80,this);
  __x = Token::text((Token *)local_80);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&section_name.field_2 + 8),
             "custom");
  bVar1 = std::operator!=(__x,stack0xffffffffffffff60);
  if (bVar1) {
    __assert_fail("!\"ParseCustomSectionAnnotation should only be called if PeekIsCustom() is true\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                  ,0x4de,"Result wabt::WastParser::ParseCustomSectionAnnotation(Module *)");
  }
  std::__cxx11::string::string((string *)local_c0);
  local_c4 = (Enum)ParseQuotedText(this,(string *)local_c0,true);
  bVar1 = Failed((Result)local_c4);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    local_c8 = 1;
    goto LAB_00207a56;
  }
  bVar1 = Match(this,Lpar);
  if (bVar1) {
    bVar1 = PeekMatch(this,After,0);
    if ((!bVar1) && (bVar1 = PeekMatch(this,Before,0), !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"before",&local_131);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_110,"after",&local_132);
      local_f0 = &local_130;
      local_e8 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_133);
      __l_00._M_len = local_e8;
      __l_00._M_array = local_f0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_e0,__l_00,&local_133);
      this_local._4_4_ = ErrorExpected(this,&local_e0,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_133);
      local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0;
      do {
        local_400 = local_400 + -1;
        std::__cxx11::string::~string((string *)local_400);
      } while (local_400 != &local_130);
      std::allocator<char>::~allocator(&local_132);
      std::allocator<char>::~allocator(&local_131);
      local_c8 = 1;
      goto LAB_00207a56;
    }
    Consume(&local_178,this);
    TVar2 = Peek(this,0);
    if ((((((TVar2 != Data) && (TVar2 != Elem)) && (TVar2 != Export)) &&
         ((TVar2 != Function && (1 < TVar2 - Global)))) &&
        ((TVar2 != Memory && ((TVar2 != Start && (TVar2 != Table)))))) &&
       ((TVar2 != Type && (TVar2 != Code)))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"type",&local_341);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_320,"import",&local_342);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_300,"function",&local_343);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_2e0,"table",&local_344);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_2c0,"memory",&local_345);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_2a0,"global",&local_346);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_280,"export",&local_347);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_260,"start",&local_348);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (asStack_240,"elem",
                 (allocator<char> *)
                 ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (asStack_220,"code",
                 (allocator<char> *)
                 ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (asStack_200,"data",
                 (allocator<char> *)
                 ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
      local_1e0 = &local_340;
      local_1d8 = 0xb;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      __l._M_len = local_1d8;
      __l._M_array = local_1e0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1d0,__l,
               (allocator_type *)
               ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      this_local._4_4_ = ErrorExpected(this,&local_1d0,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0;
      do {
        local_428 = local_428 + -1;
        std::__cxx11::string::~string((string *)local_428);
      } while (local_428 != &local_340);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<char>::~allocator(&local_348);
      std::allocator<char>::~allocator(&local_347);
      std::allocator<char>::~allocator(&local_346);
      std::allocator<char>::~allocator(&local_345);
      std::allocator<char>::~allocator(&local_344);
      std::allocator<char>::~allocator(&local_343);
      std::allocator<char>::~allocator(&local_342);
      std::allocator<char>::~allocator(&local_341);
      local_c8 = 1;
      goto LAB_00207a56;
    }
    Consume(&local_1b8,this);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = Expect(this,Rpar);
    bVar1 = Failed(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_c8 = 1;
      goto LAB_00207a56;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_368);
  custom.loc.field_1._12_4_ =
       ParseTextList(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_368);
  bVar1 = Failed((Result)custom.loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    local_c8 = 1;
  }
  else {
    custom.loc.field_1.field_0.last_column = (int)Expect(this,Rpar);
    bVar1 = Failed((Result)custom.loc.field_1.field_0.last_column);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_c8 = 1;
    }
    else {
      local_3d8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_c0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_3f0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_368);
      Custom::Custom((Custom *)local_3c8,(Location *)&token.field_2.literal_.text._M_str,local_3d8,
                     &local_3f0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_3f0);
      std::vector<wabt::Custom,_std::allocator<wabt::Custom>_>::push_back
                (&module->customs,(value_type *)local_3c8);
      Result::Result((Result *)((long)&this_local + 4),Ok);
      local_c8 = 1;
      Custom::~Custom((Custom *)local_3c8);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_368);
LAB_00207a56:
  std::__cxx11::string::~string((string *)local_c0);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseCustomSectionAnnotation(Module* module) {
  WABT_TRACE(ParseCustomSectionAnnotation);
  Location loc = GetLocation();
  Token token = Consume();
  if (token.text() != "custom") {
    assert(
        !"ParseCustomSectionAnnotation should only be called if PeekIsCustom() is true");
    return Result::Error;
  }
  std::string section_name;
  CHECK_RESULT(ParseQuotedText(&section_name));
  if (Match(TokenType::Lpar)) {
    if (!PeekMatch(TokenType::After) && !PeekMatch(TokenType::Before)) {
      return ErrorExpected({"before", "after"});
    }
    Consume();
    switch (Peek()) {
      case TokenType::Function:
      case TokenType::Type:
      case TokenType::Import:
      case TokenType::Export:
      case TokenType::Table:
      case TokenType::Global:
      case TokenType::Elem:
      case TokenType::Data:
      case TokenType::Memory:
      case TokenType::Code:
      case TokenType::Start: {
        Consume();
        break;
      }
      default: {
        return ErrorExpected({"type", "import", "function", "table", "memory",
                              "global", "export", "start", "elem", "code",
                              "data"});
      }
    }
    EXPECT(Rpar);
  }
  std::vector<uint8_t> data;
  CHECK_RESULT(ParseTextList(&data));
  EXPECT(Rpar);

  Custom custom = Custom(loc, section_name, data);
  module->customs.push_back(custom);

  return Result::Ok;
}